

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.cpp
# Opt level: O2

void __thiscall VariablePattern::advance(VariablePattern *this,int t)

{
  uint uVar1;
  pointer piVar2;
  ulong uVar3;
  int iVar4;
  
  piVar2 = (this->times).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (long)(this->times).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar2 >> 2;
  iVar4 = (this->super_Pattern).currentIndex + -1;
  do {
    uVar1 = iVar4 + 2;
    if (uVar3 <= uVar1) {
      iVar4 = (int)uVar3 + -1;
      break;
    }
    iVar4 = iVar4 + 1;
  } while (piVar2[uVar1] <= t);
  (this->super_Pattern).currentIndex = iVar4;
  return;
}

Assistant:

void VariablePattern::advance(int t)
{
    for (unsigned int i = currentIndex+1; i < times.size(); i++)
    {
        if ( t < times[i] )
        {
            currentIndex = i-1;
            return;
        }
    }
    currentIndex = times.size() - 1;
}